

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

void highsAssert(bool assert_condition,string *message)

{
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,assert_condition) != 0) {
    return;
  }
  printf("Failing highsAssert(\"%s\")\n",(message->_M_dataplus)._M_p);
  printf("assert(%s) failed ...\n",(message->_M_dataplus)._M_p);
  fflush(_stdout);
  abort();
}

Assistant:

void highsAssert(const bool assert_condition, const std::string message) {
  if (assert_condition) return;
  printf("Failing highsAssert(\"%s\")\n", message.c_str());
#ifdef NDEBUG
  // Standard assert won't trigger abort, so do it explicitly
  printf("assert(%s) failed ...\n", message.c_str());
  fflush(stdout);
  abort();
#else
  // Standard assert
  assert(assert_condition);
#endif
}